

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O2

int __thiscall pzgeom::TPZArc3D::ClassId(TPZArc3D *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZArc3D",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZNodeRep<3,_pztopology::TPZLine>::ClassId
                    (&this->super_TPZNodeRep<3,_pztopology::TPZLine>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZArc3D::ClassId() const{
    return Hash("TPZArc3D") ^ pzgeom::TPZNodeRep<3,pztopology::TPZLine>::ClassId() << 1;
}